

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O3

void __thiscall QBenchmarkPerfEventsMeasurer::start(QBenchmarkPerfEventsMeasurer *this)

{
  QList<int> *this_00;
  int *piVar1;
  int iVar2;
  QArrayDataPointer<PerfEvent> *this_01;
  long lVar3;
  int *piVar4;
  PerfEvent *pPVar5;
  PerfEvent *pPVar6;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<PerfEvent> local_d8;
  quint32 local_c0 [2];
  quint64 local_b8;
  undefined8 local_a0;
  ushort local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_c0,0,0x88);
  local_c0[1] = 0x88;
  local_a0 = 3;
  local_98 = 0x2807;
  this_01 = &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>::
             instance()->d;
  if (this_01->size == 0) {
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = (PerfEvent *)QArrayData::allocate((QArrayData **)&local_d8,0x10,0x10,4,KeepSize);
    *(undefined8 *)(local_d8.ptr + 3) = 0;
    local_d8.ptr[3].config = 4;
    *(undefined8 *)(local_d8.ptr + 2) = 0;
    local_d8.ptr[2].config = 1;
    *(undefined8 *)(local_d8.ptr + 1) = 0;
    local_d8.ptr[1].config = 0;
    *(undefined8 *)local_d8.ptr = 1;
    (local_d8.ptr)->config = 1;
    local_d8.size = 4;
    QArrayDataPointer<PerfEvent>::operator=(this_01,&local_d8);
    if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  lVar3 = (this->fds).d.size;
  if (lVar3 == 0) {
    this_00 = &this->fds;
    QList<int>::reserve(this_00,this_01->size);
    if (this_01->size != 0) {
      pPVar5 = this_01->ptr;
      pPVar6 = pPVar5 + this_01->size;
      do {
        local_c0[0] = pPVar5->type;
        local_b8 = pPVar5->config;
        lVar3 = syscall(0x12a,local_c0,0,0xffffffff,0xffffffff,8);
        iVar2 = (int)lVar3;
        if (iVar2 == -1) {
          local_98 = local_98 | 0x60;
          lVar3 = syscall(0x12a,local_c0,0,0xffffffff,0xffffffff,8);
          iVar2 = (int)lVar3;
          if (iVar2 == -1) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              start();
            }
            goto LAB_0011d58a;
          }
        }
        local_d8.d = (Data *)CONCAT44(local_d8.d._4_4_,iVar2);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)this_00,(this->fds).d.size,(int *)&local_d8);
        QList<int>::end(this_00);
        pPVar5 = pPVar5 + 1;
      } while (pPVar5 != pPVar6);
    }
    lVar3 = (this->fds).d.size;
    if (lVar3 == 0) goto LAB_0011d498;
  }
  piVar4 = (this->fds).d.ptr;
  piVar1 = piVar4 + lVar3;
  do {
    ioctl(*piVar4,0x2403);
    piVar4 = piVar4 + 1;
  } while (piVar4 != piVar1);
LAB_0011d498:
  prctl(0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0011d58a:
  __stack_chk_fail();
}

Assistant:

void QBenchmarkPerfEventsMeasurer::start()
{
    QT_WARNING_DISABLE_GCC("-Wmissing-field-initializers")
    QT_WARNING_DISABLE_CLANG("-Wmissing-field-initializers")
    perf_event_attr attr = {
        .size = sizeof attr,
        .read_format = PERF_FORMAT_TOTAL_TIME_ENABLED | PERF_FORMAT_TOTAL_TIME_RUNNING,
        .disabled = true,       // we'll enable later
        .inherit = true,        // let children processes inherit the monitoring
        .pinned = true,         // keep it running in the hardware
        .inherit_stat = true,   // aggregate all the info from child processes
        .task = true,           // trace fork/exits
    };

    QList<PerfEvent> &counters = *eventTypes;
    if (counters.isEmpty())
        counters = defaultCounters();
    if (fds.isEmpty()) {
        pid_t pid = 0;      // attach to the current process only
        int cpu = -1;       // on any CPU
        int group_fd = -1;
        int flags = PERF_FLAG_FD_CLOEXEC;

        fds.reserve(counters.size());
        for (PerfEvent counter : std::as_const(counters)) {
            attr.type = counter.type;
            attr.config = counter.config;
            int fd = perf_event_open(&attr, pid, cpu, group_fd, flags);
            if (fd == -1) {
                // probably a paranoid kernel (/proc/sys/kernel/perf_event_paranoid)
                attr.exclude_kernel = true;
                attr.exclude_hv = true;
                fd = perf_event_open(&attr, pid, cpu, group_fd, flags);
            }
            if (fd == -1) {
                perror("QBenchmarkPerfEventsMeasurer::start: perf_event_open");
                exit(1);
            }

            fds.append(fd);
        }
    }

    // enable the counters
    for (int fd : std::as_const(fds))
        ::ioctl(fd, PERF_EVENT_IOC_RESET);
    prctl(PR_TASK_PERF_EVENTS_ENABLE);
}